

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeNullConstant(Builder *this,Id typeId)

{
  Id IVar1;
  Instruction *this_00;
  undefined4 in_register_00000034;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_38 [3];
  Instruction *local_20;
  Instruction *c;
  Builder *pBStack_10;
  Id typeId_local;
  Builder *this_local;
  
  c._4_4_ = typeId;
  pBStack_10 = this;
  this_00 = (Instruction *)
            Instruction::operator_new((Instruction *)0x38,CONCAT44(in_register_00000034,typeId));
  IVar1 = getUniqueId(this);
  Instruction::Instruction(this_00,IVar1,c._4_4_,OpConstantNull);
  local_20 = this_00;
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)local_38,this_00)
  ;
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::push_back(&this->constantsTypesGlobals,(value_type *)local_38);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(local_38);
  Module::mapInstruction(&this->module,local_20);
  IVar1 = Instruction::getResultId(local_20);
  return IVar1;
}

Assistant:

Id Builder::makeNullConstant(Id typeId)
{
    Instruction* c = new Instruction(getUniqueId(), typeId, OpConstantNull);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(c));
    module.mapInstruction(c);

    return c->getResultId();
}